

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::CApiExtensionIdentBase_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  string_view s;
  char *in_R8;
  string_view separator;
  ConvertibleToStringView text;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string local_a8;
  undefined1 local_88 [16];
  generator *local_78;
  char *pcStack_70;
  ConvertibleToStringView local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string_view full_name_local;
  
  pcStack_70 = (char *)full_name._M_len;
  s._M_str = pcStack_70;
  s._M_len = (size_t)this;
  local_78 = this;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_60,s);
  text.value_._M_str = (char *)0x2e;
  text.value_._M_len = (size_t)local_60.value_._M_str;
  absl::lts_20250127::StrSplit<char>
            (&local_50,(lts_20250127 *)local_60.value_._M_len,text,(char)in_R8);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,".");
  separator._M_str = in_R8;
  separator._M_len = (size_t)local_b8._M_str;
  absl::lts_20250127::
  StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_a8,(lts_20250127 *)local_38,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8._M_len,separator);
  local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
  str._M_len = local_88._8_8_;
  str._M_str = local_b8._M_str;
  (anonymous_namespace)::ToCIdent_abi_cxx11_(__return_storage_ptr__,local_88._0_8_,str);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CApiExtensionIdentBase(absl::string_view full_name) {
  std::vector<std::string> parts = absl::StrSplit(full_name, '.');
  parts.pop_back();
  return ToCIdent(absl::StrJoin(parts, "."));
}